

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptPostDecls(HlslGrammar *this,TQualifier *qualifier)

{
  HlslParseContext *this_00;
  TSourceLoc loc;
  long lVar1;
  undefined8 uVar2;
  TString *pTVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TBuiltInVariable builtIn;
  TQualifier *pTVar8;
  char *pcVar9;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar10;
  long lVar11;
  HlslToken registerDesc;
  HlslToken idToken;
  HlslToken local_58;
  
  bVar6 = false;
  do {
    bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar5) {
      idToken.field_2.string = (TString *)0x0;
      idToken.loc.name = (TString *)0x0;
      idToken.loc.string = 0;
      idToken.loc.line = 0;
      idToken.loc.column = 0;
      bVar6 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLayout);
      if (bVar6) {
        acceptLayoutQualifierList(this,qualifier);
      }
      else {
        bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokPackOffset);
        if (bVar6) {
          bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
          if (!bVar6) {
LAB_003a6f4f:
            pcVar9 = "(";
LAB_003a6f74:
            expected(this,pcVar9);
            return false;
          }
          registerDesc.field_2.string = (TString *)0x0;
          registerDesc.loc.name = (TString *)0x0;
          registerDesc.loc.string = 0;
          registerDesc.loc.line = 0;
          registerDesc.loc.column = 0;
          bVar6 = acceptIdentifier(this,&registerDesc);
          if (!bVar6) {
            pcVar9 = "c[subcomponent][.component]";
            goto LAB_003a6f74;
          }
          local_58.field_2.string = (TString *)0x0;
          bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDot);
          if ((bVar6) && (bVar6 = acceptIdentifier(this,&local_58), !bVar6)) {
            iVar7 = 1;
            pcVar9 = "component";
            goto LAB_003a6fae;
          }
          bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
          if (!bVar6) goto LAB_003a6f58;
          HlslParseContext::handlePackOffset
                    (this->parseContext,(TSourceLoc *)&registerDesc,qualifier,
                     registerDesc.field_2.string,local_58.field_2.string);
        }
        else {
          bVar6 = acceptIdentifier(this,&idToken);
          aVar10 = idToken.field_2;
          if (!bVar6) {
            pcVar9 = "layout, semantic, packoffset, or register";
            goto LAB_003a6f74;
          }
          bVar6 = std::operator==(idToken.field_2.string,"register");
          if (bVar6) {
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
            if (!bVar6) goto LAB_003a6f4f;
            registerDesc.field_2.string = (TString *)0x0;
            registerDesc.loc.name = (TString *)0x0;
            registerDesc.loc.string = 0;
            registerDesc.loc.line = 0;
            registerDesc.loc.column = 0;
            bVar6 = acceptIdentifier(this,&registerDesc);
            if (!bVar6) {
LAB_003a6f81:
              iVar7 = 1;
              pcVar9 = "register number description";
              goto LAB_003a6fae;
            }
            if ((((registerDesc.field_2.string)->_M_string_length < 2) ||
                ((int)((registerDesc.field_2.string)->_M_dataplus)._M_p[1] - 0x30U < 10)) ||
               (bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
               aVar10 = registerDesc.field_2, !bVar6)) {
              aVar10.string = (TString *)0x0;
            }
            else {
              bVar6 = acceptIdentifier(this,&registerDesc);
              if (!bVar6) goto LAB_003a6f81;
            }
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket)
            ;
            iVar7 = 0;
            if (bVar6) {
              bVar6 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant)
              ;
              if (!bVar6) {
                pcVar9 = "literal integer";
                iVar7 = 1;
                goto LAB_003a6fae;
              }
              iVar7 = (this->super_HlslTokenStream).token.field_2.i;
              HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
              bVar6 = HlslTokenStream::acceptTokenClass
                                (&this->super_HlslTokenStream,EHTokRightBracket);
              if (!bVar6) {
                pcVar9 = "]";
                goto LAB_003a6f5f;
              }
            }
            local_58.field_2.string = (TString *)0x0;
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
            if ((bVar6) && (bVar6 = acceptIdentifier(this,&local_58), !bVar6)) {
              iVar7 = 1;
              pcVar9 = "space identifier";
              goto LAB_003a6fae;
            }
            bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
            if (!bVar6) {
LAB_003a6f58:
              pcVar9 = ")";
LAB_003a6f5f:
              iVar7 = 2;
LAB_003a6fae:
              expected(this,pcVar9);
              return iVar7 == 2;
            }
            HlslParseContext::handleRegister
                      (this->parseContext,&registerDesc.loc,qualifier,aVar10.string,
                       registerDesc.field_2.string,iVar7,local_58.field_2.string);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&registerDesc,aVar10.string);
            uVar2 = registerDesc.loc._8_8_;
            lVar1 = CONCAT44(registerDesc.loc._20_4_,registerDesc.loc.column);
            for (lVar11 = 0; uVar4 = idToken.loc._8_8_, pTVar3 = idToken.loc.name, lVar1 != lVar11;
                lVar11 = lVar11 + 1) {
              iVar7 = toupper((int)*(char *)(uVar2 + lVar11));
              *(char *)(uVar2 + lVar11) = (char)iVar7;
            }
            this_00 = this->parseContext;
            loc._20_4_ = idToken.loc._20_4_;
            loc.column = idToken.loc.column;
            builtIn = HlslTokenStream::mapSemantic
                                (&this->super_HlslTokenStream,(char *)registerDesc.loc._8_8_);
            uVar2 = idToken.loc._8_8_;
            idToken.loc.string = (int)uVar4;
            idToken.loc.line = SUB84(uVar4,4);
            loc.string = idToken.loc.string;
            loc.line = idToken.loc.line;
            loc.name = pTVar3;
            idToken.loc._8_8_ = uVar2;
            HlslParseContext::handleSemantic(this_00,loc,qualifier,builtIn,(TString *)&registerDesc)
            ;
          }
        }
      }
    }
    else {
      pTVar8 = (TQualifier *)0x175;
      bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
      if (!bVar5) {
        return bVar6;
      }
      acceptAnnotations(this,pTVar8);
    }
    bVar6 = true;
  } while( true );
}

Assistant:

bool HlslGrammar::acceptPostDecls(TQualifier& qualifier)
{
    bool found = false;

    do {
        // COLON
        if (acceptTokenClass(EHTokColon)) {
            found = true;
            HlslToken idToken;
            if (peekTokenClass(EHTokLayout))
                acceptLayoutQualifierList(qualifier);
            else if (acceptTokenClass(EHTokPackOffset)) {
                // PACKOFFSET LEFT_PAREN c[Subcomponent][.component] RIGHT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken locationToken;
                if (! acceptIdentifier(locationToken)) {
                    expected("c[subcomponent][.component]");
                    return false;
                }
                HlslToken componentToken;
                if (acceptTokenClass(EHTokDot)) {
                    if (! acceptIdentifier(componentToken)) {
                        expected("component");
                        return false;
                    }
                }
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handlePackOffset(locationToken.loc, qualifier, *locationToken.string, componentToken.string);
            } else if (! acceptIdentifier(idToken)) {
                expected("layout, semantic, packoffset, or register");
                return false;
            } else if (*idToken.string == "register") {
                // REGISTER LEFT_PAREN [shader_profile,] Type#[subcomp]opt (COMMA SPACEN)opt RIGHT_PAREN
                // LEFT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken registerDesc;  // for Type#
                HlslToken profile;
                if (! acceptIdentifier(registerDesc)) {
                    expected("register number description");
                    return false;
                }
                if (registerDesc.string->size() > 1 && !isdigit((*registerDesc.string)[1]) &&
                                                       acceptTokenClass(EHTokComma)) {
                    // Then we didn't really see the registerDesc yet, it was
                    // actually the profile.  Adjust...
                    profile = registerDesc;
                    if (! acceptIdentifier(registerDesc)) {
                        expected("register number description");
                        return false;
                    }
                }
                int subComponent = 0;
                if (acceptTokenClass(EHTokLeftBracket)) {
                    // LEFT_BRACKET subcomponent RIGHT_BRACKET
                    if (! peekTokenClass(EHTokIntConstant)) {
                        expected("literal integer");
                        return false;
                    }
                    subComponent = token.i;
                    advanceToken();
                    if (! acceptTokenClass(EHTokRightBracket)) {
                        expected("]");
                        break;
                    }
                }
                // (COMMA SPACEN)opt
                HlslToken spaceDesc;
                if (acceptTokenClass(EHTokComma)) {
                    if (! acceptIdentifier(spaceDesc)) {
                        expected ("space identifier");
                        return false;
                    }
                }
                // RIGHT_PAREN
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handleRegister(registerDesc.loc, qualifier, profile.string, *registerDesc.string, subComponent, spaceDesc.string);
            } else {
                // semantic, in idToken.string
                TString semanticUpperCase = *idToken.string;
                std::transform(semanticUpperCase.begin(), semanticUpperCase.end(), semanticUpperCase.begin(), ::toupper);
                parseContext.handleSemantic(idToken.loc, qualifier, mapSemantic(semanticUpperCase.c_str()), semanticUpperCase);
            }
        } else if (peekTokenClass(EHTokLeftAngle)) {
            found = true;
            acceptAnnotations(qualifier);
        } else
            break;

    } while (true);

    return found;
}